

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68k-dis.c
# Opt level: O2

void floatformat_to_double(floatformat *fmt,void *from,double *to)

{
  bfd_byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  double dVar5;
  ulong in_XMM1_Qb;
  anon_union_16_4_e75842b7 u;
  double local_28;
  ulong uStack_20;
  
  iVar2 = fmt->len;
  __n = (size_t)iVar2;
  memcpy(&u,from,__n);
  uVar3 = (long)iVar2 / 2 & 0xffffffff;
  uVar4 = 0;
  if ((int)((long)iVar2 / 2) < 1) {
    uVar3 = 0;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    bVar1 = u.buf[uVar4];
    __n = (size_t)((int)__n + -1);
    u.buf[uVar4] = u.buf[__n];
    u.buf[__n] = bVar1;
  }
  if (iVar2 == 4) {
    dVar5 = (double)u.f;
  }
  else if (iVar2 == 8) {
    dVar5 = (double)CONCAT44(u.ext.mantissa_high,u.ext.mantissa_low);
  }
  else {
    local_28 = (double)(CONCAT44(u.ext.mantissa_high,u.ext.mantissa_low) & 0x7fffffffffffffff) *
               1.0842021724855044e-19 + (double)(u.ext.mantissa_high >> 0x1f);
    if ((short)u.ext.exp < 0) {
      local_28 = -local_28;
      in_XMM1_Qb = in_XMM1_Qb ^ 0x8000000000000000;
    }
    uStack_20 = in_XMM1_Qb;
    dVar5 = ldexp(1.0,(u.ext.exp & 0x7fff) - 0x3fff);
    dVar5 = dVar5 * local_28;
  }
  *to = dVar5;
  return;
}

Assistant:

void floatformat_to_double(const struct floatformat* fmt, const void* from, double* to)
{
    // TODO: The code assumes a little endian machine

    union {
        bfd_byte buf[12];
        float f;
        double d;
        struct {
            uint32_t mantissa_low;
            uint32_t mantissa_high; // avoid padding
            uint16_t pad;
            uint16_t exp;
        } ext;
    } u;
    memcpy(u.buf, from, fmt->len);
    for (int i = 0; i < fmt->len / 2; ++i) {
        bfd_byte tmp = u.buf[i];
        u.buf[i] = u.buf[fmt->len - 1 - i];
        u.buf[fmt->len - 1 - i] = tmp;

    }
    if (fmt->len == 4) {
        *to = u.f;
        return;
    } else if (fmt->len == 8) {
        *to = u.d;
        return;
    }
    // Extended precision
    const uint64_t norm_mask = 0x8000000000000000;

    uint64_t mantissa = (uint64_t)u.ext.mantissa_high << 32 | u.ext.mantissa_low;

    const int sign = u.ext.exp & 0x8000 ? -1 : 1;
    const int norm = mantissa & norm_mask ? 1 : 0;
    mantissa &= norm_mask - 1;

    *to = sign * (norm + (double)mantissa  / (double)norm_mask) * pow(2, (u.ext.exp & 0x7fff) - 16383);
}